

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

int mbedtls_ecdhopt_read_initiator(mbedtls_ecdhopt_context *ctx,uchar **buf,uchar *end)

{
  mbedtls_ecp_group_id id;
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  mbedtls_ecp_curve_info *in_RAX;
  mbedtls_ecp_curve_info *curve_info;
  mbedtls_ecp_curve_info *local_28;
  
  local_28 = in_RAX;
  iVar5 = mbedtls_ecp_tls_read_curve_info(&local_28,buf,(long)end - (long)*buf);
  if (iVar5 == 0) {
    id = local_28->grp_id;
    if (id == MBEDTLS_ECP_DP_CURVE25519) {
      ctx->curve = MBEDTLS_ECP_DP_CURVE25519;
      puVar1 = *buf;
      iVar5 = -0x4f80;
      if (0x20 < (long)end - (long)puVar1) {
        *buf = puVar1 + 1;
        if (*puVar1 == ' ') {
          uVar2 = *(undefined8 *)(puVar1 + 1);
          uVar3 = *(undefined8 *)(puVar1 + 9);
          uVar4 = *(undefined8 *)(puVar1 + 0x19);
          *(undefined8 *)((long)&ctx->ctx + 0x30) = *(undefined8 *)(puVar1 + 0x11);
          *(undefined8 *)((long)&ctx->ctx + 0x38) = uVar4;
          *(undefined8 *)((long)&ctx->ctx + 0x20) = uVar2;
          *(undefined8 *)((long)&ctx->ctx + 0x28) = uVar3;
          *buf = *buf + 0x20;
          iVar5 = 0;
        }
      }
    }
    else {
      ctx->curve = id;
      iVar5 = mbedtls_ecp_group_load(&(ctx->ctx).ec.grp,id);
      if (iVar5 == 0) {
        iVar5 = mbedtls_ecp_tls_read_point
                          (&(ctx->ctx).ec.grp,&(ctx->ctx).ec.Qp,buf,(long)end - (long)*buf);
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_ecdhopt_read_initiator( mbedtls_ecdhopt_context *ctx,
                      const unsigned char **buf, const unsigned char *end )
{
    size_t blen = end - *buf;
    int ret;
    const mbedtls_ecp_curve_info *curve_info;

    if( ( ret = mbedtls_ecp_tls_read_curve_info( &curve_info, buf, blen )) != 0)
        return( ret );

    if( curve_info->grp_id == MBEDTLS_ECP_DP_CURVE25519 )
    {
        ctx->curve = MBEDTLS_ECP_DP_CURVE25519;

        if( end - *buf < 33 )
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

        if( ( *(*buf)++ != 32 ) )
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

        memcpy( ctx->ctx.x25519.peer_point, *buf, 32 );
        *buf += 32;
        return( 0 );
    }
    else
    {
        ctx->curve = curve_info->grp_id;

        if( ( ret = mbedtls_ecp_group_load( &ctx->ctx.ec.grp, curve_info->grp_id )) != 0 )
            return( ret );

        if( ( ret = mbedtls_ecp_tls_read_point( &ctx->ctx.ec.grp, &ctx->ctx.ec.Qp, buf, end - *buf ) ) != 0 )
            return( ret );

        return( 0 );
    }
}